

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int byte_size_before_serialization;
  int iVar1;
  int byte_size_after_serialization;
  undefined4 extraout_var;
  uint8 *end;
  uint8 *start;
  int byte_size;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  if (size < byte_size_before_serialization) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*this->_vptr_MessageLite[0xb])(this,data);
    if (CONCAT44(extraout_var,iVar1) - (long)data != (long)byte_size_before_serialization) {
      byte_size_after_serialization = (*this->_vptr_MessageLite[9])();
      anon_unknown_9::ByteSizeConsistencyError
                (byte_size_before_serialization,byte_size_after_serialization,iVar1 - (int)data);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  int byte_size = ByteSize();
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSize(), end - start);
  }
  return true;
}